

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O0

void adt_str_destroy(adt_str_t *self)

{
  adt_str_t *self_local;
  
  if (self != (adt_str_t *)0x0) {
    if (self->pAlloc != (uint8_t *)0x0) {
      free(self->pAlloc);
      self->pAlloc = (uint8_t *)0x0;
    }
    self->s32Size = 0;
    adt_str_clear(self);
  }
  return;
}

Assistant:

void adt_str_destroy(adt_str_t *self)
{
   if(self != 0)
   {
      if(self->pAlloc != 0)
      {
         free(self->pAlloc);
         self->pAlloc = 0;
      }
      self->s32Size = 0;
      adt_str_clear(self);
   }
}